

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<toml::local_time,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_local_time<std::vector<char,std::allocator<char>>>
          (result<std::pair<toml::local_time,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_iterator rollback;
  undefined8 uVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_type sVar6;
  const_iterator cVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  int iVar10;
  int iVar11;
  value_type *pvVar12;
  value_type *pvVar13;
  internal_error *piVar14;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_01;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *plVar15;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_02;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_03;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_04;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_05;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  string sf;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  secfrac;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  s;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  m;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  h;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  string local_338;
  allocator_type local_311;
  undefined1 local_310 [16];
  region<std::vector<char,_std::allocator<char>_>_> local_300;
  undefined1 local_2b8 [36];
  int local_294;
  undefined1 local_290 [8];
  undefined1 local_288 [8];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  const_iterator cStack_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  undefined1 local_220 [80];
  undefined1 local_1d0 [80];
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_180;
  string local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  string local_f0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [64];
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_80;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&local_80,
             (sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
              *)this,loc);
  if (local_80.is_ok_ == true) {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    pvVar12 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap(&local_80);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (&local_f0,(detail *)(pvVar12->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar12->last_)._M_current,in_RCX);
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    location(&local_138,&local_178,&local_f0);
    plVar15 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      plVar15 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      plVar15 = extraout_RDX_01;
    }
    repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>::
    invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_d0,
               (repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>> *)
               &local_138,plVar15);
    if (((local_d0[0] != true) ||
        (plVar15 = (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(((local_138.source_.
                         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_M_dataplus)._M_p +
                      (local_138.source_.
                       super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_M_string_length),
        (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_138.iter_._M_current == plVar15)) || (*local_138.iter_._M_current != ':')) {
      piVar14 = (internal_error *)__cxa_allocate_exception(0x28);
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"[error]: toml::parse_local_time: invalid year format","");
      local_2b8._0_8_ = &local_138;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[14],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_290,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)local_2b8,(char (*) [14])"should be `:`");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_290;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_220,__l_00,(allocator_type *)&local_238);
      local_338._M_dataplus._M_p = (pointer)0x0;
      local_338._M_string_length = 0;
      local_338.field_2._M_allocated_capacity = 0;
      format_underline((string *)local_310,(string *)local_1d0,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_220,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_338);
      internal_error::internal_error(piVar14,(string *)local_310);
      __cxa_throw(piVar14,&internal_error::typeinfo,internal_error::~internal_error);
    }
    local_138.iter_._M_current = local_138.iter_._M_current + 1;
    repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>::
    invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_1d0,
               (repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>> *)
               &local_138,plVar15);
    if (((local_1d0[0] != (string)0x1) ||
        (plVar15 = (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(((local_138.source_.
                         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_M_dataplus)._M_p +
                      (local_138.source_.
                       super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_M_string_length),
        (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_138.iter_._M_current == plVar15)) || (*local_138.iter_._M_current != ':')) {
      piVar14 = (internal_error *)__cxa_allocate_exception(0x28);
      local_220._0_8_ = local_220 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"[error]: toml::parse_local_time: invalid month format","");
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_138;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[14],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_290,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&local_238,(char (*) [14])"should be `:`");
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_290;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_338,__l_01,(allocator_type *)&local_158);
      local_2b8._0_8_ =
           (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0;
      local_2b8._8_8_ = (pointer)0x0;
      local_2b8._16_8_ = (pointer)0x0;
      format_underline((string *)local_310,(string *)local_220,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_338,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2b8);
      internal_error::internal_error(piVar14,(string *)local_310);
      __cxa_throw(piVar14,&internal_error::typeinfo,internal_error::~internal_error);
    }
    local_138.iter_._M_current = local_138.iter_._M_current + 1;
    last._M_current =
         (char *)local_138.source_.
                 super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
    repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>::
    invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_220,
               (repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>> *)
               &local_138,plVar15);
    if (local_220[0] == (string)0x0) {
      piVar14 = (internal_error *)__cxa_allocate_exception(0x28);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"[error]: toml::parse_local_time: invalid second format","");
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_138;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_290,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&local_158,(char (*) [5])0x14877b);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_290;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2b8,__l_02,(allocator_type *)&local_180);
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_310,&local_338,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_2b8,&local_238);
      internal_error::internal_error(piVar14,(string *)local_310);
      __cxa_throw(piVar14,&internal_error::typeinfo,internal_error::~internal_error);
    }
    pvVar13 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                        *)local_d0);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_290,(detail *)(pvVar13->first_)._M_current,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(pvVar13->last_)._M_current,last);
    local_2b8._0_8_ = (ulong)(uint)local_2b8._4_4_ << 0x20;
    iVar10 = from_string<int,int>((string *)local_290,(int *)local_2b8);
    pvVar13 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                        *)local_1d0);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_310,(detail *)(pvVar13->first_)._M_current,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(pvVar13->last_)._M_current,last);
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_238.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    iVar11 = from_string<int,int>((string *)local_310,(int *)&local_238);
    pvVar13 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                        *)local_220);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&local_338,(detail *)(pvVar13->first_)._M_current,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(pvVar13->last_)._M_current,last);
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_158.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    local_294 = from_string<int,int>(&local_338,(int *)&local_158);
    paVar2 = &local_338.field_2;
    plVar15 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      plVar15 = extraout_RDX_03;
    }
    if ((region<std::vector<char,_std::allocator<char>_>_> *)local_310._0_8_ != &local_300) {
      operator_delete((void *)local_310._0_8_,
                      (long)local_300.super_region_base._vptr_region_base + 1);
      plVar15 = extraout_RDX_04;
    }
    if (local_290 != (undefined1  [8])local_280) {
      operator_delete((void *)local_290,local_280._0_8_ + 1);
      plVar15 = extraout_RDX_05;
    }
    cVar7._M_current = local_138.iter_._M_current;
    sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>
    ::invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_290,
               (sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>
                *)&local_138,plVar15);
    if ((bool)local_290[0] == true) {
      pvVar13 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                          *)local_290);
      make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_310,(detail *)(pvVar13->first_)._M_current,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(pvVar13->last_)._M_current,last);
      std::__cxx11::string::_M_erase((ulong)local_310,0);
      if ((pointer)local_310._8_8_ != (pointer)(((ulong)local_310._8_8_ / 3) * 3)) {
        if ((ulong)local_310._8_8_ % 3 == 1) {
          std::__cxx11::string::append(local_310);
        }
        else {
          std::__cxx11::string::push_back((char)local_310);
        }
      }
      if ((ulong)local_310._8_8_ < (pointer)0x6) {
        if ((ulong)local_310._8_8_ < (pointer)0x3) {
          uVar8 = 0;
        }
        else {
          local_338._M_dataplus._M_p = local_338._M_dataplus._M_p & 0xffffffff00000000;
          uVar8 = from_string<unsigned_short,unsigned_int>((string *)local_310,(uint *)&local_338);
        }
        uVar9 = 0;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_338,(ulong)local_310);
        local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
        uVar8 = from_string<unsigned_short,unsigned_int>(&local_338,(uint *)local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != paVar2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_338,(ulong)local_310);
        local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
        uVar9 = from_string<unsigned_short,unsigned_int>(&local_338,(uint *)local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != paVar2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
      }
      if ((region<std::vector<char,_std::allocator<char>_>_> *)local_310._0_8_ != &local_300) {
        operator_delete((void *)local_310._0_8_,
                        (long)local_300.super_region_base._vptr_region_base + 1);
      }
    }
    else {
      if (cVar7._M_current != local_138.iter_._M_current) {
        piVar14 = (internal_error *)__cxa_allocate_exception(0x28);
        local_2b8._0_8_ = local_2b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,"[error]: toml::parse_local_time: invalid subsecond format",
                   "");
        local_180 = &local_138;
        std::
        pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                  ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_310,&local_180,(char (*) [5])0x14877b);
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)local_310;
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_238,__l_03,&local_311);
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_338,(string *)local_2b8,
                         (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_238,&local_158);
        internal_error::internal_error(piVar14,&local_338);
        __cxa_throw(piVar14,&internal_error::typeinfo,internal_error::~internal_error);
      }
      uVar8 = 0;
      uVar9 = 0;
    }
    if ((local_290[0] & 1) != 0) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_288);
    }
    pvVar12 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap(&local_80);
    uVar3 = local_310._0_8_;
    local_310[1] = (char)iVar11;
    local_310[0] = (char)iVar10;
    local_310._3_5_ = SUB85(uVar3,3);
    local_310[2] = (char)local_294;
    local_310._4_2_ = uVar8;
    local_310._6_2_ = uVar9;
    local_310._8_8_ = local_310._8_8_ & 0xffffffffffff0000;
    region<std::vector<char,_std::allocator<char>_>_>::region(&local_300,pvVar12);
    sVar6 = local_300.source_name_._M_string_length;
    _Var5._M_pi = local_300.source_.
                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar4 = local_300.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    paVar2 = &local_300.source_name_.field_2;
    local_280._24_8_ = local_260 + 8;
    local_288._0_2_ = local_310._8_2_;
    local_290 = (undefined1  [8])local_310._0_8_;
    local_280._0_8_ = &PTR__region_0015dac0;
    local_300.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_300.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300.source_name_._M_dataplus._M_p == paVar2) {
      local_260._16_8_ = local_300.source_name_.field_2._8_8_;
      local_300.source_name_._M_dataplus._M_p = (pointer)local_280._24_8_;
    }
    local_260._9_7_ = local_300.source_name_.field_2._M_allocated_capacity._1_7_;
    local_260[8] = local_300.source_name_.field_2._M_local_buf[0];
    local_300.source_name_._M_string_length = 0;
    local_300.source_name_.field_2._M_local_buf[0] = '\0';
    local_260._24_8_ = local_300.first_._M_current;
    cStack_240._M_current = local_300.last_._M_current;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_310._0_8_;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = local_310._8_2_;
    (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
         (size_type)&PTR__region_0015dac0;
    local_280._16_8_ = (pointer)0x0;
    *(element_type **)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) = peVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&__return_storage_ptr__->field_1 + 0x20) = _Var5._M_pi;
    local_280._8_8_ = 0;
    puVar1 = (undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38);
    *(undefined8 **)((long)&__return_storage_ptr__->field_1 + 0x28) = puVar1;
    if (local_300.source_name_._M_dataplus._M_p == (pointer)local_280._24_8_) {
      *puVar1 = local_260._8_8_;
      ((const_iterator *)
      ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8))->
      _M_current = (char *)local_260._16_8_;
    }
    else {
      *(pointer *)((long)&__return_storage_ptr__->field_1 + 0x28) =
           local_300.source_name_._M_dataplus._M_p;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_260._8_8_;
    }
    *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x30) = sVar6;
    local_260._0_8_ = 0;
    local_260._8_8_ = (ulong)(uint7)local_300.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_300.first_._M_current;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x50) = local_300.last_._M_current;
    local_300.source_name_._M_dataplus._M_p = (pointer)paVar2;
    region<std::vector<char,_std::allocator<char>_>_>::~region
              ((region<std::vector<char,_std::allocator<char>_>_> *)local_280);
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_300);
    if (local_220[0] == (string)0x1) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_220 + 8));
    }
    if (local_1d0[0] == (string)0x1) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_1d0 + 8));
    }
    if (local_d0[0] == true) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_d0 + 8));
    }
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~location(&local_138);
  }
  else {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"[error]: toml::parse_local_time: ","");
    local_290 = (undefined1  [8])this;
    local_288 = (undefined1  [8])(local_280 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"the next token is not a local_time","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_290;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_220,__l,(allocator_type *)&local_338);
    local_138.super_region_base._vptr_region_base = (_func_int **)0x0;
    local_138.source_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_138.source_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    format_underline((string *)local_d0,(string *)local_1d0,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_220,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_138);
    uVar3 = local_d0._8_8_;
    local_310._0_8_ = &local_300;
    if ((region<std::vector<char,_std::allocator<char>_>_> *)local_d0._0_8_ ==
        (region<std::vector<char,_std::allocator<char>_>_> *)(local_d0 + 0x10)) {
      local_300.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_c0._8_8_;
      local_d0._0_8_ = local_310._0_8_;
    }
    local_300.super_region_base._vptr_region_base._1_7_ = local_c0._1_7_;
    local_300.super_region_base._vptr_region_base._0_1_ = local_c0[0];
    local_d0._8_8_ = (_func_int **)0x0;
    local_c0[0] = '\0';
    __return_storage_ptr__->is_ok_ = false;
    paVar2 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar2;
    if (local_d0._0_8_ == local_310._0_8_) {
      paVar2->_M_allocated_capacity = (size_type)local_300.super_region_base._vptr_region_base;
      *(element_type **)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) =
           local_300.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_d0._0_8_;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
           (size_type)local_300.super_region_base._vptr_region_base;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = uVar3;
    local_310._8_8_ = (pointer)0x0;
    local_300.super_region_base._vptr_region_base =
         (_func_int **)((ulong)(uint7)local_c0._1_7_ << 8);
    local_d0._0_8_ = (region<std::vector<char,_std::allocator<char>_>_> *)(local_d0 + 0x10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_138);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_220);
    if (local_288 != (undefined1  [8])(local_280 + 8)) {
      operator_delete((void *)local_288,local_280._8_8_ + 1);
    }
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1d0._16_8_ + 1));
    }
  }
  if (local_80.is_ok_ == true) {
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_80.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<local_time, region<Container>>, std::string>
parse_local_time(location<Container>& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_local_time::invoke(loc))
    {
        location<std::string> inner_loc(loc.name(), token.unwrap().str());

        const auto h = lex_time_hour::invoke(inner_loc);
        if(!h || inner_loc.iter() == inner_loc.end() || *inner_loc.iter() != ':')
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_local_time: invalid year format",
                {{std::addressof(inner_loc), "should be `:`"}}));
        }
        inner_loc.advance();
        const auto m = lex_time_minute::invoke(inner_loc);
        if(!m || inner_loc.iter() == inner_loc.end() || *inner_loc.iter() != ':')
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_local_time: invalid month format",
                {{std::addressof(inner_loc), "should be `:`"}}));
        }
        inner_loc.advance();
        const auto s = lex_time_second::invoke(inner_loc);
        if(!s)
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_local_time: invalid second format",
                {{std::addressof(inner_loc), "here"}}));
        }
        local_time time(
            from_string<int>(h.unwrap().str(), 0),
            from_string<int>(m.unwrap().str(), 0),
            from_string<int>(s.unwrap().str(), 0), 0, 0);

        const auto before_secfrac = inner_loc.iter();
        if(const auto secfrac = lex_time_secfrac::invoke(inner_loc))
        {
            auto sf = secfrac.unwrap().str();
            sf.erase(sf.begin()); // sf.front() == '.'
            switch(sf.size() % 3)
            {
                case 2:  sf += '0';  break;
                case 1:  sf += "00"; break;
                case 0:  break;
                default: break;
            }
            if(sf.size() >= 6)
            {
                time.millisecond = from_string<std::uint16_t>(sf.substr(0, 3), 0u);
                time.microsecond = from_string<std::uint16_t>(sf.substr(3, 3), 0u);
            }
            else if(sf.size() >= 3)
            {
                time.millisecond = from_string<std::uint16_t>(sf, 0u);
                time.microsecond = 0u;
            }
        }
        else
        {
            if(before_secfrac != inner_loc.iter())
            {
                throw internal_error(format_underline("[error]: "
                    "toml::parse_local_time: invalid subsecond format",
                    {{std::addressof(inner_loc), "here"}}));
            }
        }
        return ok(std::make_pair(time, token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("[error]: toml::parse_local_time: ",
            {{std::addressof(loc), "the next token is not a local_time"}}));
    }
}